

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::disconnect(Federate *this)

{
  bool bVar1;
  pointer this_00;
  shared_ptr<helics::Core> *in_RDI;
  Federate *in_stack_000000f0;
  shared_ptr<helics::Core> *in_stack_ffffffffffffffd8;
  
  finalize(in_stack_000000f0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                      *)0x256c86);
  if (bVar1) {
    this_00 = std::
              unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                            *)0x256c9a);
    ConnectorFederateManager::disconnect(this_00);
  }
  CoreFactory::getEmptyCore();
  std::shared_ptr<helics::Core>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x256cc9);
  return;
}

Assistant:

void Federate::disconnect()
{
    finalize();
    if (cManager) {
        cManager->disconnect();
    }
    coreObject = CoreFactory::getEmptyCore();
}